

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O2

void monster_group_start(chunk_conflict *c,monster *mon,wchar_t which)

{
  wchar_t wVar1;
  monster_group *pmVar2;
  mon_group_list_entry *pmVar3;
  
  pmVar2 = monster_group_new();
  wVar1 = monster_group_index_new(c);
  if (wVar1 != L'\0') {
    c->monster_groups[wVar1] = pmVar2;
    pmVar2->index = wVar1;
    pmVar2->leader = mon->midx;
    pmVar3 = (mon_group_list_entry *)mem_zalloc(0x10);
    pmVar2->member_list = pmVar3;
    pmVar3->midx = mon->midx;
    mon->group_info[which].index = wVar1;
    mon->group_info[which].role = MON_GROUP_LEADER;
    return;
  }
  __assert_fail("index",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-group.c"
                ,0xf8,"void monster_group_start(struct chunk *, struct monster *, int)");
}

Assistant:

void monster_group_start(struct chunk *c, struct monster *mon, int which)
{
	/* Get a group and a group index */
	struct monster_group *group = monster_group_new();
	int index = monster_group_index_new(c);
	assert(index);

	/* Put the group in the group list */
	c->monster_groups[index] = group;

	/* Fill out the group */
	group->index = index;
	group->leader = mon->midx;
	group->member_list = mem_zalloc(sizeof(struct mon_group_list_entry));
	group->member_list->midx = mon->midx;

	/* Write the index to the monster's group info, make it leader */
	mon->group_info[which].index = index;
	mon->group_info[which].role = MON_GROUP_LEADER;
}